

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.h
# Opt level: O2

bool ViconCGStreamIO::VBufferDetail<0>::Read(VBufferImpl *i_rBufferImpl,string *o_rValue)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  pointer puVar5;
  UInt32 Size;
  uint local_1c;
  
  local_1c = 0;
  bVar4 = VBufferImpl::ReadPod<unsigned_int>(i_rBufferImpl,&local_1c);
  if (bVar4) {
    uVar1 = i_rBufferImpl->m_Offset;
    puVar2 = (i_rBufferImpl->m_Buffer).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (i_rBufferImpl->m_Buffer).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_1c + uVar1 <= (uint)((int)puVar2 - (int)puVar3)) {
      puVar5 = (pointer)0x0;
      if (puVar3 != puVar2) {
        puVar5 = puVar3;
      }
      std::__cxx11::string::assign((char *)o_rValue,(ulong)(puVar5 + uVar1));
      i_rBufferImpl->m_Offset = local_1c + uVar1;
      return true;
    }
  }
  return false;
}

Assistant:

static bool Read( const VBufferImpl & i_rBufferImpl, std::string & o_rValue )
  {
    ViconCGStreamType::UInt32 Size = 0;
    if( !i_rBufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    const unsigned int Offset = i_rBufferImpl.Offset();
    if( Offset + Size > i_rBufferImpl.Length() )
    {
      return false;
    }
    o_rValue.assign( reinterpret_cast< const char * >( i_rBufferImpl.Raw() + Offset ), Size );
    i_rBufferImpl.SetOffset( Offset + Size );
    return true;
  }